

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

PointerType __thiscall capnp::_::PointerBuilder::getPointerType(PointerBuilder *this)

{
  anon_union_4_5_35ddcec3_for_WirePointer_1 *paVar1;
  uint uVar2;
  PointerType PVar3;
  SegmentBuilder *this_00;
  WirePointer *pWVar4;
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  pWVar4 = this->pointer;
  uVar2 = (pWVar4->offsetAndKind).value;
  if ((pWVar4->field_1).structRef == (StructRef)0x0 && uVar2 == 0) {
    PVar3 = NULL_;
  }
  else {
    this_00 = this->segment;
    if ((uVar2 & 3) == 2) {
      this_00 = BuilderArena::getSegment
                          ((BuilderArena *)(this_00->super_SegmentReader).arena,
                           (SegmentId)(pWVar4->field_1).structRef);
      uVar2 = (pWVar4->offsetAndKind).value;
      pWVar4 = (WirePointer *)
               ((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
               (ulong)(uVar2 & 0xfffffff8));
      if ((uVar2 & 4) != 0) {
        paVar1 = &pWVar4->field_1;
        pWVar4 = pWVar4 + 1;
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)paVar1->structRef);
      }
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    uVar2 = (pWVar4->offsetAndKind).value;
    switch(uVar2 & 3) {
    case 0:
      PVar3 = STRUCT;
      break;
    case 1:
      PVar3 = LIST;
      break;
    case 2:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0xa58,FAILED,(char *)0x0,"\"far pointer not followed?\"",
                 (char (*) [26])"far pointer not followed?");
      kj::_::Debug::Fault::fatal(&f);
    case 3:
      _kjCondition.value = uVar2 == 3;
      if (!_kjCondition.value) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[21]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0xa5e,FAILED,"ptr->isCapability()","_kjCondition,\"unknown pointer type\"",
                   &_kjCondition,(char (*) [21])"unknown pointer type");
        kj::_::Debug::Fault::fatal(&f);
      }
      PVar3 = CAPABILITY;
    }
  }
  return PVar3;
}

Assistant:

PointerType PointerBuilder::getPointerType() const {
  if(pointer->isNull()) {
    return PointerType::NULL_;
  } else {
    WirePointer* ptr = pointer;
    SegmentBuilder* sgmt = segment;
    WireHelpers::followFars(ptr, ptr->target(), sgmt);
    switch(ptr->kind()) {
      case WirePointer::FAR:
        KJ_FAIL_ASSERT("far pointer not followed?");
      case WirePointer::STRUCT:
        return PointerType::STRUCT;
      case WirePointer::LIST:
        return PointerType::LIST;
      case WirePointer::OTHER:
        KJ_REQUIRE(ptr->isCapability(), "unknown pointer type");
        return PointerType::CAPABILITY;
    }
    KJ_UNREACHABLE;
  }
}